

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall CompressedXipReader::~CompressedXipReader(CompressedXipReader *this)

{
  element_type *peVar1;
  pointer puVar2;
  pointer puVar3;
  element_type *peVar4;
  int iVar5;
  uint uVar6;
  size_t __n;
  int local_6c;
  ByteVector compdata;
  ByteVector data;
  undefined4 extraout_var;
  
  (this->super_ReadWriter)._vptr_ReadWriter = (_func_int **)&PTR__CompressedXipReader_001428f8;
  peVar1 = (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super_ReadWriter)._vptr_ReadWriter[4])(peVar1,0);
    compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while( true ) {
      iVar5 = (*(((this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_ReadWriter)._vptr_ReadWriter[8])();
      if ((char)iVar5 != '\0') break;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                 (ulong)this->_fullblocksize,(allocator_type *)&local_6c);
      peVar1 = (this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = (*(peVar1->super_ReadWriter)._vptr_ReadWriter[2])
                        (peVar1,CONCAT44(data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint32_t)
                                         data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start),
                         (long)data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         CONCAT44(data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (uint32_t)
                                  data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
      __n = CONCAT44(extraout_var,iVar5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&compdata,
                 (size_type)
                 (compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 ((ulong)this->_fullblocksize -
                 (long)compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start)));
      if (__n != 0) {
        memmove(compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + -(ulong)this->_fullblocksize,
                (void *)CONCAT44(data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (uint32_t)
                                 data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start),__n);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&compdata,
                 (size_type)
                 (compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish +
                 (__n - (long)(compdata.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + this->_fullblocksize))));
      local_6c = iVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->_compsizes,(uint *)&local_6c);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    puVar2 = (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (*(((this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ReadWriter)._vptr_ReadWriter[6])();
    printf("updated cxip: %d blocks ( full=%x, comp=%x )\n",
           (ulong)((long)puVar3 - (long)puVar2) >> 2 & 0xffffffff,(ulong)uVar6,
           (ulong)(uint)((int)compdata.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (int)compdata.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start));
    peVar4 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar4->_vptr_ReadWriter[4])(peVar4,0x34);
    peVar4 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         ((uint)((ulong)((long)(this->_compsizes).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_compsizes).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1) & 0xfffffffe) + 0x44;
    (*peVar4->_vptr_ReadWriter[3])(peVar4,&data,4);
    peVar4 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ =
         (uint32_t)
         ((ulong)((long)(this->_compsizes).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->_compsizes).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
    (*peVar4->_vptr_ReadWriter[3])(peVar4,&data,4);
    peVar4 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = this->_fullblocksize;
    (*peVar4->_vptr_ReadWriter[3])(peVar4,&data,4);
    peVar4 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x58505253;
    (*peVar4->_vptr_ReadWriter[3])(peVar4,&data,4);
    std::
    for_each<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,CompressedXipReader::~CompressedXipReader()::_lambda(unsigned_int)_1_>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_8991fb9c)this);
    peVar4 = (this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar4->_vptr_ReadWriter[3])
              (peVar4,compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
               (long)compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&compdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_memrd).super___shared_ptr<MemoryReader,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->_cache).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->_compsizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->_compptrs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

virtual ~CompressedXipReader()
    {
        if (!_memrd)
            return;

        // create new compressed data
        _memrd->setpos(0);
        ByteVector compdata;

        while (!_memrd->eof()) {
            ByteVector data(_fullblocksize);
            size_t n= _memrd->read(&data[0], data.size());

            compdata.resize(compdata.size()+_fullblocksize);
            size_t c= compress(&data[0], n, &compdata[compdata.size()-_fullblocksize]);
            compdata.resize(compdata.size()-_fullblocksize+c);

            _compsizes.push_back(c);
        }
        printf("updated cxip: %d blocks ( full=%x, comp=%x )\n", (int)_compsizes.size(), (int)_memrd->size(), (int)compdata.size());

        // write new header
        _r->setpos(0x34);
        _r->write32le(0x44+2*_compsizes.size());
        _r->write32le(_compsizes.size());
        _r->write32le(_fullblocksize);
        _r->write32le(0x58505253);
        std::for_each(_compsizes.begin(), _compsizes.end(), [this](uint32_t c) { _r->write16le(c); });
        _r->write(&compdata[0], compdata.size());
    }